

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  Fts5IndexIter *pFVar1;
  int iVar2;
  int iVar3;
  Fts5PoslistReader *pFVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Fts5PoslistReader *p;
  long iPos;
  ulong uVar8;
  bool bVar9;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  
  uVar7 = 0;
  iVar3 = 4;
  p = aStatic;
  for (; iVar2 = (int)uVar7, pTerm != (Fts5ExprTerm *)0x0; pTerm = pTerm->pSynonym) {
    pFVar1 = pTerm->pIter;
    pFVar4 = p;
    if (((pFVar1->bEof == '\0') && (pFVar1->iRowid == iRowid)) && (pFVar1->nData != 0)) {
      if (iVar2 == iVar3) {
        pFVar4 = (Fts5PoslistReader *)sqlite3_malloc64((long)iVar3 << 6);
        if (pFVar4 == (Fts5PoslistReader *)0x0) {
          iVar3 = 7;
          goto LAB_00192db8;
        }
        memcpy(pFVar4,p,(long)iVar3 << 5);
        iVar3 = iVar3 * 2;
        if (p != aStatic) {
          sqlite3_free(p);
        }
      }
      sqlite3Fts5PoslistReaderInit(pFVar1->pData,pFVar1->nData,pFVar4 + iVar2);
      uVar7 = (ulong)(iVar2 + 1);
    }
    p = pFVar4;
  }
  if (iVar2 != 1) {
    writer.iPrev = 0;
    pBuf->n = 0;
    iVar3 = 0;
    if (iVar2 < 1) {
      uVar7 = 0;
    }
    lVar6 = -1;
    do {
      iPos = 0x7fffffffffffffff;
      pFVar4 = p;
      uVar8 = uVar7;
      while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
        if (pFVar4->bEof == '\0') {
          lVar5 = pFVar4->iPos;
          if (lVar5 == lVar6) {
            iVar2 = sqlite3Fts5PoslistReaderNext(pFVar4);
            if (iVar2 != 0) goto LAB_00192d56;
            lVar5 = pFVar4->iPos;
          }
          if (lVar5 < iPos) {
            iPos = lVar5;
          }
        }
LAB_00192d56:
        pFVar4 = pFVar4 + 1;
      }
      if ((iPos == 0x7fffffffffffffff) || (iVar3 != 0)) goto LAB_00192d8d;
      iVar3 = sqlite3Fts5PoslistWriterAppend(pBuf,&writer,iPos);
      lVar6 = iPos;
    } while( true );
  }
  *pa = p->a;
  *pn = p->n;
  iVar3 = 0;
LAB_00192db8:
  if (p != aStatic) {
    sqlite3_free(p);
  }
  return iVar3;
LAB_00192d8d:
  if (iVar3 == 0) {
    *pa = pBuf->p;
    *pn = pBuf->n;
  }
  goto LAB_00192db8;
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm, 
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}